

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O3

void start_pass_prep(j_compress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_c_prep_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  
  pjVar1 = cinfo->prep;
  if (pass_mode != JBUF_PASS_THRU) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 4;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  *(JDIMENSION *)&pjVar1[6].start_pass = cinfo->image_height;
  *(undefined8 *)((long)&pjVar1[6].start_pass + 4) = 0;
  *(int *)((long)&pjVar1[6].pre_process_data + 4) = cinfo->max_v_samp_factor * 2;
  return;
}

Assistant:

METHODDEF(void)
start_pass_prep(j_compress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_prep_ptr prep = (my_prep_ptr)cinfo->prep;

  if (pass_mode != JBUF_PASS_THRU)
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Initialize total-height counter for detecting bottom of image */
  prep->rows_to_go = cinfo->image_height;
  /* Mark the conversion buffer empty */
  prep->next_buf_row = 0;
#ifdef CONTEXT_ROWS_SUPPORTED
  /* Preset additional state variables for context mode.
   * These aren't used in non-context mode, so we needn't test which mode.
   */
  prep->this_row_group = 0;
  /* Set next_buf_stop to stop after two row groups have been read in. */
  prep->next_buf_stop = 2 * cinfo->max_v_samp_factor;
#endif
}